

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>>
          (String *__return_storage_ptr__,detail *this,vector<bool,_std::allocator<bool>_> *lhs,
          char *op,vector<bool,_std::allocator<bool>_> *rhs)

{
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  StringMaker<std::vector<bool,_std::allocator<bool>_>_>::convert
            (&local_48,(vector<bool,_std::allocator<bool>_> *)this);
  String::String(&local_60,(char *)lhs);
  String::operator+(&local_30,&local_48,&local_60);
  StringMaker<std::vector<bool,_std::allocator<bool>_>_>::convert
            (&SStack_78,(vector<bool,_std::allocator<bool>_> *)op);
  String::operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }